

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-base.h
# Opt level: O0

ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_> * __thiscall
mp::pre::ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>>::operator=
          (ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_> *this
          ,ModelValues<mp::pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>_> *vm)

{
  string *psVar1;
  void *pvVar2;
  ModelValues<mp::pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>_> *in_RSI;
  ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_> *in_RDI;
  ValueMap<std::vector<double,_std::allocator<double>_>,_int> *in_stack_00000168;
  ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> *in_stack_00000170;
  
  psVar1 = ModelValues<mp::pre::ValueMap<std::vector<double,std::allocator<double>>,int>>::
           GetName_abi_cxx11_((ModelValues<mp::pre::ValueMap<std::vector<double,std::allocator<double>>,int>>
                               *)in_RSI);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)psVar1);
  ModelValues<mp::pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>_>::GetVarValues
            (in_RSI);
  ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>::operator=
            (in_stack_00000170,in_stack_00000168);
  ModelValues<mp::pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>_>::GetConValues
            (in_RSI);
  ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>::operator=
            (in_stack_00000170,in_stack_00000168);
  ModelValues<mp::pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>_>::GetObjValues
            (in_RSI);
  ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>::operator=
            (in_stack_00000170,in_stack_00000168);
  pvVar2 = ModelValues<mp::pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>_>::
           ExtraData(in_RSI);
  in_RDI->p_extra_ = pvVar2;
  return in_RDI;
}

Assistant:

ModelValues& operator=(const ModelValues<VM2>& vm) {
    name_ = vm.GetName();
    vars_ = vm.GetVarValues();
    cons_ = vm.GetConValues();
    objs_ = vm.GetObjValues();
    p_extra_ = vm.ExtraData();
    return *this;
  }